

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Decode
          (Minefield_Response_NACK_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  KUINT8 ui8Tmp;
  KString local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x19 < iVar4 + (uint)KVar3) {
    puVar2 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish != puVar2) {
      (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
    (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ReqID,stream);
    KDataStream::Read(stream,&this->m_ui8ReqID);
    KDataStream::Read(stream,&this->m_ui8NumMisPdus);
    local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
    if (this->m_ui8NumMisPdus != '\0') {
      bVar5 = 0;
      do {
        KDataStream::Read(stream,(KUOCTET *)&local_50);
        __position._M_current =
             (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vSeqNums,
                     __position,(uchar *)&local_50);
        }
        else {
          *__position._M_current = (uchar)local_50._M_dataplus._M_p;
          ppuVar1 = &(this->m_vSeqNums).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        bVar5 = bVar5 + 1;
      } while (bVar5 < this->m_ui8NumMisPdus);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
  KException::KException(this_00,&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Response_NACK_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_RESPONSE_NACK_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSeqNums.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_ui8ReqID
           >> m_ui8NumMisPdus;

    KUINT8 ui8Tmp = 0;
    for( KUINT8 i = 0; i < m_ui8NumMisPdus; ++i )
    {
        stream >> ui8Tmp;
        m_vSeqNums.push_back( ui8Tmp );
    }
}